

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlParserCtxtGetErrorHandler(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlParserCtxtPyCtxtPtr local_48;
  undefined *local_40;
  PyObject *pyobj_ctxt;
  xmlParserCtxtPyCtxtPtr pyCtxt;
  xmlParserCtxtPtr ctxt;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:xmlParserCtxtGetErrorHandler",&local_40);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (local_40 == &_Py_NoneStruct) {
      local_48 = (xmlParserCtxtPyCtxtPtr)0x0;
    }
    else {
      local_48 = *(xmlParserCtxtPyCtxtPtr *)(local_40 + 0x10);
    }
    pyCtxt = local_48;
    ctxt = (xmlParserCtxtPtr)PyTuple_New(2);
    if (pyCtxt[0x1a].arg == (PyObject *)0x0) {
      PyTuple_SetItem(ctxt,0,&_Py_NoneStruct);
      _Py_XINCREF((PyObject *)&_Py_NoneStruct);
      PyTuple_SetItem(ctxt,1,&_Py_NoneStruct);
      _Py_XINCREF((PyObject *)&_Py_NoneStruct);
    }
    else {
      pyobj_ctxt = pyCtxt[0x1a].arg;
      PyTuple_SetItem(ctxt,0,pyobj_ctxt->ob_refcnt);
      _Py_XINCREF((PyObject *)pyobj_ctxt->ob_refcnt);
      PyTuple_SetItem(ctxt,1,pyobj_ctxt->ob_type);
      _Py_XINCREF((PyObject *)pyobj_ctxt->ob_type);
    }
    self_local = (PyObject *)ctxt;
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_xmlParserCtxtGetErrorHandler(ATTRIBUTE_UNUSED PyObject *self, PyObject *args) 
{
    PyObject *py_retval;
    xmlParserCtxtPtr ctxt;
    xmlParserCtxtPyCtxtPtr pyCtxt;
    PyObject *pyobj_ctxt;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlParserCtxtGetErrorHandler",
		          &pyobj_ctxt))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);
    py_retval = PyTuple_New(2);
    if (ctxt->_private != NULL) {
	pyCtxt = (xmlParserCtxtPyCtxtPtr)ctxt->_private;

	PyTuple_SetItem(py_retval, 0, pyCtxt->f);
	Py_XINCREF(pyCtxt->f);
	PyTuple_SetItem(py_retval, 1, pyCtxt->arg);
	Py_XINCREF(pyCtxt->arg);
    }
    else {
	/* no python error handler registered */
	PyTuple_SetItem(py_retval, 0, Py_None);
	Py_XINCREF(Py_None);
	PyTuple_SetItem(py_retval, 1, Py_None);
	Py_XINCREF(Py_None);
    }
    return(py_retval);
}